

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O3

uint32_t svb_select_avx_d1_init
                   (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,int slot)

{
  long lVar1;
  int iVar2;
  uint32_t uVar3;
  long lVar4;
  byte bVar6;
  int iVar5;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_40;
  ulong local_38;
  xmm_t PrevLow;
  
  iVar2 = 0;
  if (count < 0x20) goto LAB_0013f5b2;
  uVar13 = count >> 5;
  local_40 = count;
  local_68 = vpbroadcastd_avx512vl();
  iVar2 = 0;
  uVar11 = *(ulong *)keyPtr;
  if (uVar13 != 1) {
    uVar14 = 1;
    iVar2 = 0;
    local_38 = uVar13;
    uVar10 = uVar11;
    do {
      uVar11 = *(ulong *)(keyPtr + uVar14 * 8);
      auVar15 = vpshufd_avx(local_68,0xff);
      if (uVar10 == 0) {
        auVar17 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
        iVar5 = slot - (iVar2 + 8);
        auVar17 = vpmovzxbw_avx(auVar17);
        auVar16 = vpslldq_avx(auVar17,2);
        auVar17 = vpaddd_avx(auVar16,auVar17);
        auVar16 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar17,auVar16);
        auVar16 = vpmovzxwd_avx(auVar17);
        auVar17 = vpunpckhwd_avx(auVar17,(undefined1  [16])0x0);
        local_58 = vpaddd_avx(auVar15,auVar16);
        local_68 = vpaddd_avx(local_58,auVar17);
        if (slot < iVar2 + 8) goto LAB_0013f2d0;
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
        auVar16 = vpshufd_avx(local_68,0xff);
        iVar12 = slot - (iVar2 + 0x10);
        auVar15 = vpmovzxbw_avx(auVar15);
        auVar17 = vpslldq_avx(auVar15,2);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar17 = vpmovzxwd_avx(auVar15);
        auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
        local_58 = vpaddd_avx(auVar16,auVar17);
        local_68 = vpaddd_avx(local_58,auVar15);
        if (slot < iVar2 + 0x10) goto LAB_0013f45b;
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
        auVar16 = vpshufd_avx(local_68,0xff);
        iVar5 = slot - (iVar2 + 0x18);
        auVar15 = vpmovzxbw_avx(auVar15);
        auVar17 = vpslldq_avx(auVar15,2);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar17 = vpmovzxwd_avx(auVar15);
        auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
        local_58 = vpaddd_avx(auVar16,auVar17);
        local_68 = vpaddd_avx(local_58,auVar15);
        if (slot < iVar2 + 0x18) goto LAB_0013f502;
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8));
        auVar16 = vpshufd_avx(local_68,0xff);
        auVar15 = vpmovzxbw_avx(auVar15);
        auVar17 = vpslldq_avx(auVar15,2);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar17 = vpmovzxwd_avx(auVar15);
        auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
        local_58 = vpaddd_avx(auVar16,auVar17);
        local_68 = vpaddd_avx(local_58,auVar15);
        if (slot < iVar2 + 0x20) goto LAB_0013f45b;
        dataPtr = (uint8_t *)((long)dataPtr + 0x20);
      }
      else {
        bVar6 = (byte)(uVar10 >> 8);
        uVar9 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar10 & 0xff];
        auVar17 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                              *(undefined1 (*) [16])
                               (shuffleTable[0] + (uint)((int)(uVar10 & 0xff) << 4)));
        auVar16 = vpslldq_avx(auVar17,4);
        auVar17 = vpaddd_avx(auVar16,auVar17);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar17,8);
        local_58 = vpaddd_avx(auVar15,auVar17);
        auVar17 = vpshufd_avx(local_58,0xff);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar9),
                              (undefined1  [16])shuffleTable[bVar6]);
        iVar12 = slot - (iVar2 + 8);
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar17 = vpaddd_avx(auVar15,auVar17);
        auVar15 = vpslldq_avx(auVar15,8);
        local_68 = vpaddd_avx(auVar17,auVar15);
        if (slot < iVar2 + 8) goto LAB_0013f2d0;
        auVar17 = vpshufd_avx(local_68,0xff);
        uVar7 = (uint)uVar10 >> 0x10 & 0xff;
        lVar4 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                [bVar6] + uVar9;
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [bVar6] + uVar9),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uVar7 << 4)));
        uVar9 = uVar10 >> 0x18 & 0xff;
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        local_58 = vpaddd_avx(auVar15,auVar17);
        auVar17 = vpshufd_avx(local_58,0xff);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar7] + lVar4),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
        iVar5 = iVar2 + 0x10;
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        local_68 = vpaddd_avx(auVar15,auVar17);
        if (slot < iVar5) goto LAB_0013f502;
        lVar4 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar7] + lVar4;
        auVar17 = vpshufd_avx(local_68,0xff);
        uVar8 = uVar10 >> 0x20 & 0xff;
        lVar1 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar9] + lVar4;
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar9] + lVar4),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar8 << 4)));
        uVar9 = uVar10 >> 0x28 & 0xff;
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        local_58 = vpaddd_avx(auVar15,auVar17);
        auVar17 = vpshufd_avx(local_58,0xff);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar8] + lVar1),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar9 << 4)));
        iVar12 = slot - (iVar2 + 0x18);
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        local_68 = vpaddd_avx(auVar15,auVar17);
        if (slot < iVar2 + 0x18) goto LAB_0013f3ed;
        lVar1 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar8] + lVar1;
        auVar17 = vpshufd_avx(local_68,0xff);
        uVar8 = uVar10 >> 0x30 & 0xff;
        lVar4 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar9] + lVar1;
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar9] + lVar1),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar8 << 4)));
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        local_58 = vpaddd_avx(auVar15,auVar17);
        auVar17 = vpshufd_avx(local_58,0xff);
        auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                      [uVar8] + lVar4),
                              (undefined1  [16])shuffleTable[uVar10 >> 0x38]);
        auVar16 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar16,auVar15);
        auVar16 = vpslldq_avx(auVar15,8);
        auVar15 = vpaddd_avx(auVar15,auVar16);
        local_68 = vpaddd_avx(auVar15,auVar17);
        if (slot < iVar2 + 0x20) goto LAB_0013f502;
        dataPtr = *(undefined1 (*) [16])dataPtr +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar8] +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar10 >> 0x38] + lVar4;
      }
      iVar2 = iVar2 + 0x20;
      uVar14 = uVar14 + 1;
      uVar10 = uVar11;
    } while (uVar13 != uVar14);
  }
  if (uVar11 == 0) {
    auVar15 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
    auVar16 = vpshufd_avx(local_68,0xff);
    iVar12 = iVar2 + 8;
    auVar15 = vpmovzxbw_avx(auVar15);
    auVar17 = vpslldq_avx(auVar15,2);
    auVar15 = vpaddd_avx(auVar17,auVar15);
    auVar17 = vpslldq_avx(auVar15,4);
    auVar15 = vpaddd_avx(auVar15,auVar17);
    auVar17 = vpmovzxwd_avx(auVar15);
    local_58 = vpaddd_avx(auVar16,auVar17);
    auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
    local_68 = vpaddd_avx(local_58,auVar15);
    if (iVar12 <= slot) {
      auVar15 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
      auVar16 = vpshufd_avx(local_68,0xff);
      iVar5 = slot - (iVar2 + 0x10);
      auVar15 = vpmovzxbw_avx(auVar15);
      auVar17 = vpslldq_avx(auVar15,2);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      auVar17 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar15,auVar17);
      auVar17 = vpmovzxwd_avx(auVar15);
      auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
      local_58 = vpaddd_avx(auVar16,auVar17);
      local_68 = vpaddd_avx(local_58,auVar15);
      if (iVar2 + 0x10 <= slot) {
        auVar15 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
        auVar16 = vpshufd_avx(local_68,0xff);
        iVar12 = iVar2 + 0x18;
        auVar15 = vpmovzxbw_avx(auVar15);
        auVar17 = vpslldq_avx(auVar15,2);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar17 = vpmovzxwd_avx(auVar15);
        local_58 = vpaddd_avx(auVar16,auVar17);
        auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
        local_68 = vpaddd_avx(local_58,auVar15);
        if (slot < iVar12) {
LAB_0013f45b:
          local_78[0] = local_58;
          local_78[1] = local_68;
          lVar4 = (long)iVar5;
          goto LAB_0013f519;
        }
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)(*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8);
        auVar15 = vpmovzxbw_avx(auVar15);
        auVar16 = vpshufd_avx(local_68,0xff);
        auVar17 = vpslldq_avx(auVar15,2);
        auVar15 = vpaddd_avx(auVar17,auVar15);
        auVar17 = vpslldq_avx(auVar15,4);
        auVar15 = vpaddd_avx(auVar15,auVar17);
        auVar17 = vpmovzxwd_avx(auVar15);
        auVar15 = vpunpckhwd_avx(auVar15,(undefined1  [16])0x0);
        local_58 = vpaddd_avx(auVar16,auVar17);
        local_68 = vpaddd_avx(local_58,auVar15);
        if (iVar2 + 0x20 <= slot) {
          prev = local_68._12_4_;
          dataPtr = (uint8_t *)((long)dataPtr + 0x20);
          goto LAB_0013f5ad;
        }
      }
      local_78[0] = local_58;
      local_78[1] = local_68;
      lVar4 = (long)(slot - iVar12);
      goto LAB_0013f519;
    }
  }
  else {
    auVar17 = vpshufd_avx(local_68,0xff);
    uVar13 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                    [uVar11 & 0xff];
    auVar15 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                          *(undefined1 (*) [16])
                           (shuffleTable[0] + (uint)((int)(uVar11 & 0xff) << 4)));
    bVar6 = (byte)(uVar11 >> 8);
    auVar16 = vpslldq_avx(auVar15,4);
    auVar15 = vpaddd_avx(auVar16,auVar15);
    auVar17 = vpaddd_avx(auVar15,auVar17);
    auVar15 = vpslldq_avx(auVar15,8);
    local_58 = vpaddd_avx(auVar17,auVar15);
    auVar17 = vpshufd_avx(local_58,0xff);
    auVar15 = vpshufb_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + uVar13),
                          (undefined1  [16])shuffleTable[bVar6]);
    auVar16 = vpslldq_avx(auVar15,4);
    auVar15 = vpaddd_avx(auVar16,auVar15);
    auVar17 = vpaddd_avx(auVar15,auVar17);
    auVar15 = vpslldq_avx(auVar15,8);
    local_68 = vpaddd_avx(auVar17,auVar15);
    if (iVar2 + 8 <= slot) {
      auVar17 = vpshufd_avx(local_68,0xff);
      uVar7 = (uint)uVar11 >> 0x10 & 0xff;
      lVar4 = "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
              [bVar6] + uVar13;
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [bVar6] + uVar13),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uVar7 << 4)));
      uVar13 = uVar11 >> 0x18 & 0xff;
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      local_58 = vpaddd_avx(auVar15,auVar17);
      auVar17 = vpshufd_avx(local_58,0xff);
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar7] + lVar4),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar13 << 4)));
      iVar5 = iVar2 + 0x10;
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      local_68 = vpaddd_avx(auVar15,auVar17);
      if (slot < iVar5) {
        local_78[0] = local_58;
        local_78[1] = local_68;
        lVar4 = (long)(slot - (iVar2 + 8));
        goto LAB_0013f519;
      }
      lVar4 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar7] + lVar4;
      auVar17 = vpshufd_avx(local_68,0xff);
      uVar10 = uVar11 >> 0x20 & 0xff;
      lVar1 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar13] + lVar4;
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar13] + lVar4),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
      uVar13 = uVar11 >> 0x28 & 0xff;
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      local_58 = vpaddd_avx(auVar15,auVar17);
      auVar17 = vpshufd_avx(local_58,0xff);
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar10] + lVar1),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar13 << 4)));
      iVar12 = slot - (iVar2 + 0x18);
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      local_68 = vpaddd_avx(auVar15,auVar17);
      if (slot < iVar2 + 0x18) {
LAB_0013f3ed:
        local_78[0] = local_58;
        local_78[1] = local_68;
        lVar4 = (long)(slot - iVar5);
        goto LAB_0013f519;
      }
      lVar1 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar10] + lVar1;
      auVar17 = vpshufd_avx(local_68,0xff);
      uVar10 = uVar11 >> 0x30 & 0xff;
      lVar4 = (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                     [uVar13] + lVar1;
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar13] + lVar1),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar10 << 4)));
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      local_58 = vpaddd_avx(auVar15,auVar17);
      auVar17 = vpshufd_avx(local_58,0xff);
      auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                             (*(undefined1 (*) [16])dataPtr +
                             (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                    [uVar10] + lVar4),(undefined1  [16])shuffleTable[uVar11 >> 0x38]
                           );
      auVar16 = vpslldq_avx(auVar15,4);
      auVar15 = vpaddd_avx(auVar16,auVar15);
      auVar16 = vpslldq_avx(auVar15,8);
      auVar15 = vpaddd_avx(auVar15,auVar16);
      local_68 = vpaddd_avx(auVar15,auVar17);
      if (slot < iVar2 + 0x20) {
LAB_0013f502:
        local_78[0] = local_58;
        lVar4 = (long)iVar12;
        local_78[1] = local_68;
        goto LAB_0013f519;
      }
      prev = local_68._12_4_;
      dataPtr = *(undefined1 (*) [16])dataPtr +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar10] +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar11 >> 0x38] + lVar4;
LAB_0013f5ad:
      iVar2 = iVar2 + 0x20;
LAB_0013f5b2:
      uVar11 = count >> 2 & 0xfffffffffffffff8;
      uVar3 = svb_select_scalar_d1_init(keyPtr + uVar11,dataPtr,uVar11,prev,slot - iVar2);
      return uVar3;
    }
  }
LAB_0013f2d0:
  local_78[0] = local_58;
  local_78[1] = local_68;
  lVar4 = (long)(slot - iVar2);
LAB_0013f519:
  auVar15 = vpshufb_avx(*(undefined1 (*) [16])
                         local_78[*(int *)(_extract_from_xmm_indices + lVar4 * 4)],
                        *(undefined1 (*) [16])
                         (streamvbyte_shuffle_mask_bytes + (((uint)lVar4 & 3) << 4)));
  return auVar15._0_4_;
}

Assistant:

uint32_t svb_select_avx_d1_init(uint8_t *keyPtr, uint8_t *dataPtr,
                                uint64_t count, uint32_t prev, int slot) {
  uint64_t keybytes = count / 4; // number of key bytes
  int consumedInts = 0;

  // make sure that the loop is run at least once
  if (keybytes >= 8) {
    xmm_t PrevHi = _mm_set1_epi32(prev);
    xmm_t PrevLow;
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        dataPtr += 32;
        consumedInts += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 8)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 16)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 8));

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 24)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 16));

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (slot < consumedInts + 32)
        return _extract_from_xmm(&PrevHi, &PrevLow, slot - (consumedInts + 24));

      consumedInts += 32;
    }

    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        dataPtr += 32;
        consumedInts += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 8)
          return _extract_from_xmm(&PrevHi, &PrevLow, slot - consumedInts);

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 16)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 8));

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 24)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 16));

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (slot < consumedInts + 32)
          return _extract_from_xmm(&PrevHi, &PrevLow,
                                   slot - (consumedInts + 24));

        consumedInts += 32;
      }
      // extract the highest integer which was stored so far;
      // it will be the "prev" value for the remaining data
      prev = (uint32_t)_mm_extract_epi32(PrevHi, 3);
    }
  }
  uint64_t consumedkeys = keybytes - (keybytes & 7);
  uint32_t keysleft = count & 31;
  return svb_select_scalar_d1_init(keyPtr + consumedkeys, dataPtr, keysleft,
                                   prev, slot - consumedInts);
}